

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_FullRHS(void *arkode_mem,realtype t,N_Vector y,N_Vector f,int mode)

{
  int iVar1;
  N_Vector *pp_Var2;
  ARKodeMem ark_mem_00;
  N_Vector x;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_FullRHS",&ark_mem,&step_mem);
  ark_mem_00 = ark_mem;
  if (iVar1 != 0) {
    return iVar1;
  }
  if (mode == 2) {
    if (step_mem->explicit_rhs != 0) {
      iVar1 = (*step_mem->fse)(t,y,ark_mem->tempv2,ark_mem->user_data);
      step_mem->nfse = step_mem->nfse + 1;
      if (iVar1 != 0) goto LAB_003bd6f1;
    }
    ark_mem_00 = ark_mem;
    if (step_mem->implicit_rhs != 0) {
      iVar1 = (*step_mem->fsi)(t,y,step_mem->sdata,ark_mem->user_data);
      step_mem->nfsi = step_mem->nfsi + 1;
      if (iVar1 != 0) goto LAB_003bd6f1;
    }
    iVar1 = mriStepInnerStepper_FullRhs(step_mem->stepper,t,y,f,2);
    ark_mem_00 = ark_mem;
    if (iVar1 != 0) goto LAB_003bd6f1;
    if (step_mem->explicit_rhs == 0) {
      if (step_mem->implicit_rhs == 0) goto LAB_003bd761;
    }
    else {
      if (step_mem->implicit_rhs == 0) {
LAB_003bd761:
        x = ark_mem->tempv2;
        goto LAB_003bd768;
      }
      N_VLinearSum(1.0,ark_mem->tempv2,1.0,f,f);
    }
    x = step_mem->sdata;
    goto LAB_003bd768;
  }
  if ((mode != 1) && (mode != 0)) {
    arkProcessError(ark_mem,-8,"ARKode::MRIStep","mriStep_FullRHS","Unknown full RHS mode");
    return -8;
  }
  if (step_mem->explicit_rhs != 0) {
    iVar1 = (*step_mem->fse)(t,y,*step_mem->Fse,ark_mem->user_data);
    step_mem->nfse = step_mem->nfse + 1;
    if (iVar1 != 0) goto LAB_003bd6f1;
  }
  ark_mem_00 = ark_mem;
  if (step_mem->implicit_rhs != 0) {
    iVar1 = (*step_mem->fsi)(t,y,*step_mem->Fsi,ark_mem->user_data);
    step_mem->nfsi = step_mem->nfsi + 1;
    if (iVar1 != 0) goto LAB_003bd6f1;
  }
  iVar1 = mriStepInnerStepper_FullRhs(step_mem->stepper,t,y,f,2);
  ark_mem_00 = ark_mem;
  if (iVar1 != 0) {
LAB_003bd6f1:
    arkProcessError(ark_mem_00,-8,"ARKode::MRIStep","mriStep_FullRHS",
                    "At t = %lg, the right-hand side routine failed in an unrecoverable manner.",t);
    return -8;
  }
  if (step_mem->explicit_rhs == 0) {
    if (step_mem->implicit_rhs == 0) goto LAB_003bd747;
LAB_003bd740:
    pp_Var2 = step_mem->Fsi;
  }
  else {
    if (step_mem->implicit_rhs != 0) {
      N_VLinearSum(1.0,*step_mem->Fse,1.0,f,f);
      goto LAB_003bd740;
    }
LAB_003bd747:
    pp_Var2 = step_mem->Fse;
  }
  x = *pp_Var2;
LAB_003bd768:
  N_VLinearSum(1.0,x,1.0,f,f);
  return 0;
}

Assistant:

int mriStep_FullRHS(void* arkode_mem, realtype t, N_Vector y, N_Vector f,
                    int mode)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_FullRHS",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* perform RHS functions contingent on 'mode' argument */
  switch(mode) {

  /* ARK_FULLRHS_START: called at the beginning of a simulation
     Store the vector fs(t,y) in F[0] for possible reuse
     in the first stage of the subsequent time step */
  case ARK_FULLRHS_START:

    /* call fse if the problem has an explicit component */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
         arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                         "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
         return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
    } else {
      if (step_mem->implicit_rhs) {         /* implicit */
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
      } else {                          /* explicit */
        N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      }
    }

    break;


  /* ARK_FULLRHS_END: called at the end of a successful step
     This always recomputes the full RHS (i.e., this is the
     same as case 0). */
  case ARK_FULLRHS_END:

    /* call fse if the problem has an explicit component */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, step_mem->Fse[0], ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->Fsi[0], ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
    } else {
      if (step_mem->implicit_rhs) {         /* implicit */
        N_VLinearSum(ONE, step_mem->Fsi[0], ONE, f, f);
      } else {                          /* explicit */
        N_VLinearSum(ONE, step_mem->Fse[0], ONE, f, f);
      }
    }
    break;

  /*  ARK_FULLRHS_OTHER: called for dense output in-between steps
      store the intermediate calculations in such a way as to not
      interfere with the other two modes */
  case ARK_FULLRHS_OTHER:

    /* call fse if the problem has an explicit component (store in ark_tempv2) */
    if (step_mem->explicit_rhs) {
      retval = step_mem->fse(t, y, ark_mem->tempv2, ark_mem->user_data);
      step_mem->nfse++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }

    /* call fsi if the problem has an implicit component (store in sdata) */
    if (step_mem->implicit_rhs) {
      retval = step_mem->fsi(t, y, step_mem->sdata, ark_mem->user_data);
      step_mem->nfsi++;
      if (retval != 0) {
        arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                        "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
        return(ARK_RHSFUNC_FAIL);
      }
    }


    /* call ff (force new RHS computation) */
    retval = mriStepInnerStepper_FullRhs(step_mem->stepper, t, y, f,
                                         ARK_FULLRHS_OTHER);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                      "mriStep_FullRHS", MSG_ARK_RHSFUNC_FAILED, t);
      return(ARK_RHSFUNC_FAIL);
    }

    /* combine RHS vectors into output */
    if (step_mem->explicit_rhs && step_mem->implicit_rhs) { /* ImEx */
      N_VLinearSum(ONE, ark_mem->tempv2, ONE, f, f);
      N_VLinearSum(ONE, step_mem->sdata, ONE, f, f);
    } else {                   /* implicit */
      if (step_mem->implicit_rhs) {
        N_VLinearSum(ONE, step_mem->sdata, ONE, f, f);
      } else {                                           /* explicit */
        N_VLinearSum(ONE, ark_mem->tempv2, ONE, f, f);
      }
    }

    break;

  default:
    /* return with RHS failure if unknown mode is passed */
    arkProcessError(ark_mem, ARK_RHSFUNC_FAIL, "ARKode::MRIStep",
                    "mriStep_FullRHS", "Unknown full RHS mode");
    return(ARK_RHSFUNC_FAIL);
  }

  return(ARK_SUCCESS);
}